

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fixups.cpp
# Opt level: O3

error_code __thiscall
pstore::exchange::import_ns::details::section_name::string_value(section_name *this,string *s)

{
  int iVar1;
  iterator iVar2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  error_code eVar5;
  undefined1 local_336;
  undefined1 local_335;
  undefined1 local_334;
  section_kind local_333 [19];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_320;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_2f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_2d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_2a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_280;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_208;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_140;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_118;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_50;
  
  if (string_value(std::__cxx11::string_const&)::map_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&string_value(std::__cxx11::string_const&)::map_abi_cxx11_);
    if (iVar1 != 0) {
      local_333[0x12] = 0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[5],_pstore::repo::section_kind,_true>
                (&local_320,(char (*) [5])0x1e0c1a,local_333 + 0x12);
      local_333[0x11] = 1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[5],_pstore::repo::section_kind,_true>
                (&local_2f8,(char (*) [5])0x1ea861,local_333 + 0x11);
      local_333[0x10] = 2;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[4],_pstore::repo::section_kind,_true>
                (&local_2d0,(char (*) [4])0x1d93f1,local_333 + 0x10);
      local_333[0xf] = 3;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[7],_pstore::repo::section_kind,_true>
                (&local_2a8,(char (*) [7])"rel_ro",local_333 + 0xf);
      local_333[0xe] = 4;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[26],_pstore::repo::section_kind,_true>
                (&local_280,(char (*) [26])"mergeable_1_byte_c_string",local_333 + 0xe);
      local_333[0xd] = 5;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[26],_pstore::repo::section_kind,_true>
                (&local_258,(char (*) [26])"mergeable_2_byte_c_string",local_333 + 0xd);
      local_333[0xc] = 6;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[26],_pstore::repo::section_kind,_true>
                (&local_230,(char (*) [26])"mergeable_4_byte_c_string",local_333 + 0xc);
      local_333[0xb] = 7;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[18],_pstore::repo::section_kind,_true>
                (&local_208,(char (*) [18])"mergeable_const_4",local_333 + 0xb);
      local_333[10] = 8;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[18],_pstore::repo::section_kind,_true>
                (&local_1e0,(char (*) [18])"mergeable_const_8",local_333 + 10);
      local_333[9] = 9;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[19],_pstore::repo::section_kind,_true>
                (&local_1b8,(char (*) [19])"mergeable_const_16",local_333 + 9);
      local_333[8] = 10;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[19],_pstore::repo::section_kind,_true>
                (&local_190,(char (*) [19])"mergeable_const_32",local_333 + 8);
      local_333[7] = 0xb;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[10],_pstore::repo::section_kind,_true>
                (&local_168,(char (*) [10])"read_only",local_333 + 7);
      local_333[6] = 0xc;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[12],_pstore::repo::section_kind,_true>
                (&local_140,(char (*) [12])"thread_data",local_333 + 6);
      local_333[5] = 0xd;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[11],_pstore::repo::section_kind,_true>
                (&local_118,(char (*) [11])"thread_bss",local_333 + 5);
      local_333[4] = 0xe;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[11],_pstore::repo::section_kind,_true>
                (&local_f0,(char (*) [11])0x1eace1,local_333 + 4);
      local_333[3] = 0xf;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[10],_pstore::repo::section_kind,_true>
                (&local_c8,(char (*) [10])"debug_loc",local_333 + 3);
      local_333[2] = 0x10;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[13],_pstore::repo::section_kind,_true>
                (&local_a0,(char (*) [13])"debug_string",local_333 + 2);
      local_333[1] = 0x11;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[13],_pstore::repo::section_kind,_true>
                (&local_78,(char (*) [13])"debug_ranges",local_333 + 1);
      local_333[0] = linked_definitions;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[19],_pstore::repo::section_kind,_true>
                (&local_50,(char (*) [19])"linked_definitions",local_333);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,pstore::repo::section_kind>,std::allocator<std::pair<std::__cxx11::string_const,pstore::repo::section_kind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,pstore::repo::section_kind>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,pstore::repo::section_kind>,std::allocator<std::pair<std::__cxx11::string_const,pstore::repo::section_kind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&string_value(std::__cxx11::string_const&)::map_abi_cxx11_,&local_320,
                 &stack0xffffffffffffffd8,0,&local_334,&local_335,&local_336);
      lVar3 = -0x2f8;
      paVar4 = &local_50.first.field_2;
      do {
        if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar4->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar4->_M_allocated_capacity)[-2],
                          paVar4->_M_allocated_capacity + 1);
        }
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar4->_M_allocated_capacity + -5);
        lVar3 = lVar3 + 0x28;
      } while (lVar3 != 0);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>_>
                   ::~unordered_map,&string_value(std::__cxx11::string_const&)::map_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&string_value(std::__cxx11::string_const&)::map_abi_cxx11_);
    }
  }
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&string_value(std::__cxx11::string_const&)::map_abi_cxx11_._M_h,s);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_true>
      ._M_cur == (__node_type *)0x0) {
    eVar5 = make_error_code(unknown_section_name);
  }
  else {
    *(this->section_).ptr_ =
         *(section_kind *)
          ((long)iVar2.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_true>
                 ._M_cur + 0x28);
    eVar5 = rule::pop(&this->super_rule);
  }
  return eVar5;
}

Assistant:

std::error_code section_name::string_value (std::string const & s) {
                    // TODO: this map appears both here and in the fragment code.
#define X(a) {#a, pstore::repo::section_kind::a},
                    static std::unordered_map<std::string, repo::section_kind> map = {
                        PSTORE_MCREPO_SECTION_KINDS};
#undef X
                    auto const pos = map.find (s);
                    if (pos == map.end ()) {
                        return error::unknown_section_name;
                    }
                    *section_ = pos->second;
                    return pop ();
                }